

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_uint64 ma_dr_wav__read_list_labelled_cue_region_to_metadata_obj
                    (ma_dr_wav__metadata_parser *pParser,ma_dr_wav_metadata *pMetadata,
                    ma_uint64 chunkSize)

{
  ma_uint8 *pmVar1;
  uint uVar2;
  size_t bytesRead;
  ma_uint64 mVar3;
  size_t sVar4;
  ma_uint8 buffer [20];
  char *local_38;
  ma_uint32 local_30;
  undefined8 local_2c;
  
  mVar3 = (*pParser->onRead)(pParser->pReadSeekUserData,&local_38,0x14);
  if (mVar3 == 0x14) {
    pMetadata->type = ma_dr_wav_metadata_type_list_labelled_cue_region;
    (pMetadata->data).bext.pDescription = local_38;
    (pMetadata->data).smpl.samplePeriodNanoseconds = local_30;
    *(undefined8 *)((long)&(pMetadata->data).cue.pCuePoints + 4) = local_2c;
    uVar2 = (int)chunkSize - 0x14;
    if (uVar2 == 0) {
      (pMetadata->data).smpl.smpteFormat = 0;
      (pMetadata->data).labelledCueRegion.pString = (char *)0x0;
      mVar3 = 0x14;
    }
    else {
      (pMetadata->data).smpl.smpteFormat = (int)chunkSize - 0x15;
      pmVar1 = pParser->pDataCursor;
      pParser->pDataCursor = pmVar1 + uVar2;
      (pMetadata->data).labelledCueRegion.pString = (char *)pmVar1;
      sVar4 = (*pParser->onRead)(pParser->pReadSeekUserData,pmVar1,(ulong)uVar2);
      mVar3 = sVar4 + 0x14;
    }
  }
  return mVar3;
}

Assistant:

MA_PRIVATE ma_uint64 ma_dr_wav__read_list_labelled_cue_region_to_metadata_obj(ma_dr_wav__metadata_parser* pParser, ma_dr_wav_metadata* pMetadata, ma_uint64 chunkSize)
{
    ma_uint8 buffer[MA_DR_WAV_LIST_LABELLED_TEXT_BYTES];
    ma_uint64 totalBytesRead = 0;
    size_t bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, buffer, sizeof(buffer), &totalBytesRead);
    MA_DR_WAV_ASSERT(pParser->stage == ma_dr_wav__metadata_parser_stage_read);
    if (bytesJustRead == sizeof(buffer)) {
        ma_uint32 sizeIncludingNullTerminator;
        pMetadata->type                                = ma_dr_wav_metadata_type_list_labelled_cue_region;
        pMetadata->data.labelledCueRegion.cuePointId   = ma_dr_wav_bytes_to_u32(buffer + 0);
        pMetadata->data.labelledCueRegion.sampleLength = ma_dr_wav_bytes_to_u32(buffer + 4);
        pMetadata->data.labelledCueRegion.purposeId[0] = buffer[8];
        pMetadata->data.labelledCueRegion.purposeId[1] = buffer[9];
        pMetadata->data.labelledCueRegion.purposeId[2] = buffer[10];
        pMetadata->data.labelledCueRegion.purposeId[3] = buffer[11];
        pMetadata->data.labelledCueRegion.country      = ma_dr_wav_bytes_to_u16(buffer + 12);
        pMetadata->data.labelledCueRegion.language     = ma_dr_wav_bytes_to_u16(buffer + 14);
        pMetadata->data.labelledCueRegion.dialect      = ma_dr_wav_bytes_to_u16(buffer + 16);
        pMetadata->data.labelledCueRegion.codePage     = ma_dr_wav_bytes_to_u16(buffer + 18);
        sizeIncludingNullTerminator = (ma_uint32)chunkSize - MA_DR_WAV_LIST_LABELLED_TEXT_BYTES;
        if (sizeIncludingNullTerminator > 0) {
            pMetadata->data.labelledCueRegion.stringLength = sizeIncludingNullTerminator - 1;
            pMetadata->data.labelledCueRegion.pString      = (char*)ma_dr_wav__metadata_get_memory(pParser, sizeIncludingNullTerminator, 1);
            MA_DR_WAV_ASSERT(pMetadata->data.labelledCueRegion.pString != NULL);
            ma_dr_wav__metadata_parser_read(pParser, pMetadata->data.labelledCueRegion.pString, sizeIncludingNullTerminator, &totalBytesRead);
        } else {
            pMetadata->data.labelledCueRegion.stringLength = 0;
            pMetadata->data.labelledCueRegion.pString      = NULL;
        }
    }
    return totalBytesRead;
}